

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_creation.cpp
# Opt level: O2

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraph::createSphereShapedHair
          (SceneGraph *this,Vec3fa *center,float radius,
          Ref<embree::SceneGraph::MaterialNode> *material)

{
  ulong uVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  pointer pvVar4;
  size_t sVar5;
  Vec3fx *pVVar6;
  undefined8 uVar7;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *paVar8;
  Node *pNVar9;
  HairSetNode *this_00;
  Vec3fx *pVVar10;
  long lVar11;
  size_t i;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  Ref<embree::SceneGraph::MaterialNode> local_80;
  undefined8 local_78;
  float fStack_70;
  float fStack_6c;
  float local_68;
  Node *local_50;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  Hair local_38;
  
  local_78 = center;
  local_68 = radius;
  this_00 = (HairSetNode *)::operator_new(0x118);
  local_80 = (Ref<embree::SceneGraph::MaterialNode>)material->ptr;
  if (local_80.ptr != (MaterialNode *)0x0) {
    (*((local_80.ptr)->super_Node).super_RefCount._vptr_RefCount[2])();
  }
  HairSetNode::HairSetNode
            (this_00,RTC_GEOMETRY_TYPE_FLAT_BEZIER_CURVE,&local_80,(BBox1f)0x3f80000000000000,1);
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  if (local_80.ptr != (MaterialNode *)0x0) {
    (*((local_80.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  local_38.vertex = 0;
  local_38.id = 0;
  local_50 = (Node *)this;
  std::
  vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
  ::emplace_back<embree::SceneGraph::HairSetNode::Hair>(&this_00->hairs,&local_38);
  pvVar4 = (this_00->positions).
           super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  fVar15 = -local_68;
  fVar16 = (local_78->field_0).m128[0];
  fVar17 = (local_78->field_0).m128[1];
  fVar18 = (local_78->field_0).m128[2];
  sVar5 = pvVar4->size_active;
  uVar12 = pvVar4->size_alloced;
  uVar1 = sVar5 + 1;
  if (uVar12 < uVar1) {
    uVar13 = uVar12;
    uVar14 = uVar1;
    if (uVar12 != 0) {
      for (; uVar14 = uVar13, uVar13 < uVar1; uVar13 = uVar13 * 2 + (ulong)(uVar13 * 2 == 0)) {
      }
    }
    if (uVar12 != uVar14) {
      pVVar6 = pvVar4->items;
      pVVar10 = (Vec3fx *)alignedMalloc(uVar14 << 4,0x10);
      pvVar4->items = pVVar10;
      lVar11 = 0;
      for (uVar12 = 0; uVar12 < pvVar4->size_active; uVar12 = uVar12 + 1) {
        puVar2 = (undefined8 *)((long)&pVVar6->field_0 + lVar11);
        uVar7 = puVar2[1];
        puVar3 = (undefined8 *)((long)&pvVar4->items->field_0 + lVar11);
        *puVar3 = *puVar2;
        puVar3[1] = uVar7;
        lVar11 = lVar11 + 0x10;
      }
      alignedFree(pVVar6);
      pvVar4->size_active = sVar5;
      pvVar4->size_alloced = uVar14;
    }
  }
  pvVar4->size_active = uVar1;
  pVVar6 = pvVar4->items + sVar5;
  (pVVar6->field_0).m128[0] = fVar15 + fVar16;
  (pVVar6->field_0).m128[1] = fVar17 + 0.0;
  (pVVar6->field_0).m128[2] = fVar18 + 0.0;
  (pVVar6->field_0).m128[3] = local_68;
  pvVar4 = (this_00->positions).
           super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  fVar16 = (local_78->field_0).m128[0];
  fVar17 = (local_78->field_0).m128[1];
  fVar18 = (local_78->field_0).m128[2];
  sVar5 = pvVar4->size_active;
  uVar12 = pvVar4->size_alloced;
  uVar1 = sVar5 + 1;
  if (uVar12 < uVar1) {
    uVar13 = uVar12;
    uVar14 = uVar1;
    if (uVar12 != 0) {
      for (; uVar14 = uVar13, uVar13 < uVar1; uVar13 = uVar13 * 2 + (ulong)(uVar13 * 2 == 0)) {
      }
    }
    if (uVar12 != uVar14) {
      pVVar6 = pvVar4->items;
      pVVar10 = (Vec3fx *)alignedMalloc(uVar14 << 4,0x10);
      pvVar4->items = pVVar10;
      lVar11 = 0;
      for (uVar12 = 0; uVar12 < pvVar4->size_active; uVar12 = uVar12 + 1) {
        puVar2 = (undefined8 *)((long)&pVVar6->field_0 + lVar11);
        uVar7 = puVar2[1];
        puVar3 = (undefined8 *)((long)&pvVar4->items->field_0 + lVar11);
        *puVar3 = *puVar2;
        puVar3[1] = uVar7;
        lVar11 = lVar11 + 0x10;
      }
      alignedFree(pVVar6);
      pvVar4->size_active = sVar5;
      pvVar4->size_alloced = uVar14;
    }
  }
  fVar15 = local_68;
  pvVar4->size_active = uVar1;
  pVVar6 = pvVar4->items + sVar5;
  (pVVar6->field_0).m128[0] = fVar16 + 0.0;
  (pVVar6->field_0).m128[1] = fVar17 + 0.0;
  (pVVar6->field_0).m128[2] = fVar18 + 0.0;
  (pVVar6->field_0).m128[3] = local_68;
  pvVar4 = (this_00->positions).
           super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  fVar16 = (local_78->field_0).m128[0] + 0.0;
  fVar17 = (local_78->field_0).m128[1] + 0.0;
  fVar18 = (local_78->field_0).m128[2] + 0.0;
  sVar5 = pvVar4->size_active;
  uVar12 = pvVar4->size_alloced;
  uVar1 = sVar5 + 1;
  if (uVar12 < uVar1) {
    uVar13 = uVar12;
    uVar14 = uVar1;
    if (uVar12 != 0) {
      for (; uVar14 = uVar13, uVar13 < uVar1; uVar13 = uVar13 * 2 + (ulong)(uVar13 * 2 == 0)) {
      }
    }
    if (uVar12 != uVar14) {
      pVVar6 = pvVar4->items;
      local_48 = fVar16;
      fStack_44 = fVar17;
      fStack_40 = fVar18;
      fStack_3c = (local_78->field_0).m128[3] + 0.0;
      pVVar10 = (Vec3fx *)alignedMalloc(uVar14 << 4,0x10);
      pvVar4->items = pVVar10;
      lVar11 = 0;
      for (uVar12 = 0; uVar12 < pvVar4->size_active; uVar12 = uVar12 + 1) {
        puVar2 = (undefined8 *)((long)&pVVar6->field_0 + lVar11);
        uVar7 = puVar2[1];
        puVar3 = (undefined8 *)((long)&pvVar4->items->field_0 + lVar11);
        *puVar3 = *puVar2;
        puVar3[1] = uVar7;
        lVar11 = lVar11 + 0x10;
      }
      alignedFree(pVVar6);
      pvVar4->size_active = sVar5;
      pvVar4->size_alloced = uVar14;
      fVar16 = local_48;
      fVar17 = fStack_44;
      fVar18 = fStack_40;
    }
  }
  pvVar4->size_active = uVar1;
  pVVar6 = pvVar4->items + sVar5;
  (pVVar6->field_0).m128[0] = fVar16;
  (pVVar6->field_0).m128[1] = fVar17;
  (pVVar6->field_0).m128[2] = fVar18;
  (pVVar6->field_0).m128[3] = fVar15;
  pvVar4 = (this_00->positions).
           super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  paVar8 = &local_78->field_0;
  fVar16 = local_68 + (local_78->field_0).m128[0];
  fVar17 = (local_78->field_0).m128[1] + 0.0;
  fVar18 = (local_78->field_0).m128[2] + 0.0;
  sVar5 = pvVar4->size_active;
  uVar12 = pvVar4->size_alloced;
  uVar1 = sVar5 + 1;
  if (uVar12 < uVar1) {
    uVar13 = uVar12;
    uVar14 = uVar1;
    if (uVar12 != 0) {
      for (; uVar14 = uVar13, uVar13 < uVar1; uVar13 = uVar13 * 2 + (ulong)(uVar13 * 2 == 0)) {
      }
    }
    if (uVar12 != uVar14) {
      local_78 = (Vec3fa *)CONCAT44(fVar17,fVar16);
      pVVar6 = pvVar4->items;
      fStack_70 = fVar18;
      fStack_6c = paVar8->m128[3] + 0.0;
      pVVar10 = (Vec3fx *)alignedMalloc(uVar14 << 4,0x10);
      pvVar4->items = pVVar10;
      lVar11 = 0;
      for (uVar12 = 0; uVar12 < pvVar4->size_active; uVar12 = uVar12 + 1) {
        puVar2 = (undefined8 *)((long)&pVVar6->field_0 + lVar11);
        uVar7 = puVar2[1];
        puVar3 = (undefined8 *)((long)&pvVar4->items->field_0 + lVar11);
        *puVar3 = *puVar2;
        puVar3[1] = uVar7;
        lVar11 = lVar11 + 0x10;
      }
      alignedFree(pVVar6);
      pvVar4->size_active = sVar5;
      pvVar4->size_alloced = uVar14;
      fVar16 = (float)local_78;
      fVar17 = local_78._4_4_;
      fVar18 = fStack_70;
    }
  }
  pNVar9 = local_50;
  pvVar4->size_active = uVar1;
  pVVar6 = pvVar4->items + sVar5;
  (pVVar6->field_0).m128[0] = fVar16;
  (pVVar6->field_0).m128[1] = fVar17;
  (pVVar6->field_0).m128[2] = fVar18;
  (pVVar6->field_0).m128[3] = fVar15;
  (local_50->super_RefCount)._vptr_RefCount = (_func_int **)this_00;
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[3])(this_00);
  return (Ref<embree::SceneGraph::Node>)pNVar9;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::createSphereShapedHair(const Vec3fa& center, const float radius, Ref<MaterialNode> material)
  {
    Ref<SceneGraph::HairSetNode> mesh = new SceneGraph::HairSetNode(RTC_GEOMETRY_TYPE_FLAT_BEZIER_CURVE,material,BBox1f(0,1),1);
    mesh->hairs.push_back(SceneGraph::HairSetNode::Hair(0,0));
    mesh->positions[0].push_back(Vec3ff(center+Vec3fa(-radius,0,0),radius));
    mesh->positions[0].push_back(Vec3ff(center+Vec3fa(0,0,0),radius));
    mesh->positions[0].push_back(Vec3ff(center+Vec3fa(0,0,0),radius));
    mesh->positions[0].push_back(Vec3ff(center+Vec3fa(+radius,0,0),radius));
    return mesh.dynamicCast<SceneGraph::Node>();
  }